

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

type __thiscall
llvm::yaml::yamlize<llvm::StringRef>
          (yaml *this,IO *io,StringRef *Val,bool param_3,EmptyContext *Ctx)

{
  StringRef S;
  StringRef S_00;
  bool bVar1;
  QuotingType QVar2;
  ulong uVar3;
  string *Str_00;
  void *pvVar4;
  StringRef Scalar;
  Twine local_100;
  ScalarTraits<llvm::StringRef,_void> *local_e8;
  char *local_e0;
  undefined1 local_d8 [8];
  StringRef Result;
  undefined1 local_b8 [8];
  StringRef Str_1;
  undefined1 auStack_98 [8];
  StringRef Str;
  undefined1 local_78 [8];
  raw_string_ostream Buffer;
  string Storage;
  EmptyContext *Ctx_local;
  bool param_2_local;
  StringRef *Val_local;
  IO *io_local;
  
  uVar3 = (**(code **)(*(long *)this + 0x10))();
  if ((uVar3 & 1) == 0) {
    StringRef::StringRef((StringRef *)local_b8);
    Result.Length = (size_t)local_b8;
    S.Length = (size_t)Str_1.Data;
    S.Data = (char *)local_b8;
    QVar2 = ScalarTraits<llvm::StringRef,_void>::mustQuote(S);
    (**(code **)(*(long *)this + 0xd8))(this,local_b8,QVar2);
    local_e8 = (ScalarTraits<llvm::StringRef,_void> *)local_b8;
    local_e0 = Str_1.Data;
    pvVar4 = IO::getContext((IO *)this);
    Scalar.Length = (size_t)pvVar4;
    Scalar.Data = local_e0;
    _local_d8 = ScalarTraits<llvm::StringRef,_void>::input(local_e8,Scalar,io,(StringRef *)Ctx);
    bVar1 = StringRef::empty((StringRef *)local_d8);
    if (!bVar1) {
      Twine::Twine(&local_100,(StringRef *)local_d8);
      (**(code **)(*(long *)this + 0xf8))(this,&local_100);
    }
  }
  else {
    std::__cxx11::string::string((string *)&Buffer.OS);
    raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_78,(string *)&Buffer.OS);
    pvVar4 = IO::getContext((IO *)this);
    ScalarTraits<llvm::StringRef,_void>::output((StringRef *)io,pvVar4,(raw_ostream *)local_78);
    Str_00 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_78);
    StringRef::StringRef((StringRef *)auStack_98,Str_00);
    Str_1.Length = (size_t)auStack_98;
    S_00.Length = (size_t)Str.Data;
    S_00.Data = (char *)auStack_98;
    QVar2 = ScalarTraits<llvm::StringRef,_void>::mustQuote(S_00);
    (**(code **)(*(long *)this + 0xd8))(this,auStack_98,QVar2);
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_78);
    std::__cxx11::string::~string((string *)&Buffer.OS);
  }
  return;
}

Assistant:

typename std::enable_if<has_ScalarTraits<T>::value, void>::type
yamlize(IO &io, T &Val, bool, EmptyContext &Ctx) {
  if ( io.outputting() ) {
    std::string Storage;
    raw_string_ostream Buffer(Storage);
    ScalarTraits<T>::output(Val, io.getContext(), Buffer);
    StringRef Str = Buffer.str();
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
  }
  else {
    StringRef Str;
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
    StringRef Result = ScalarTraits<T>::input(Str, io.getContext(), Val);
    if ( !Result.empty() ) {
      io.setError(Twine(Result));
    }
  }
}